

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

void Q_Constr(QMatrix *Q,char *Name,size_t Dim,Boolean Symmetry,ElOrderType ElOrder,
             InstanceType Instance,Boolean OwnData)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *pcVar3;
  size_t *psVar4;
  ElType **ppEVar5;
  Boolean *pBVar6;
  Real *pRVar7;
  QMatrixType *pQVar8;
  ulong local_38;
  size_t RoC;
  InstanceType Instance_local;
  ElOrderType ElOrder_local;
  Boolean Symmetry_local;
  size_t Dim_local;
  char *Name_local;
  QMatrix *Q_local;
  
  sVar2 = strlen(Name);
  pcVar3 = (char *)malloc(sVar2 + 1);
  Q->Name = pcVar3;
  if (Q->Name == (char *)0x0) {
    LASError(LASMemAllocErr,"Q_Constr",Name,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(Q->Name,Name);
  }
  Q->Dim = Dim;
  Q->Symmetry = Symmetry;
  Q->ElOrder = ElOrder;
  Q->Instance = Instance;
  Q->LockLevel = 0;
  Q->MultiplD = 1.0;
  Q->MultiplU = 1.0;
  Q->MultiplL = 1.0;
  Q->OwnData = OwnData;
  if (OwnData != False) {
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      psVar4 = (size_t *)malloc((Dim + 1) * 8);
      Q->Len = psVar4;
      ppEVar5 = (ElType **)malloc((Dim + 1) * 8);
      Q->El = ppEVar5;
      pBVar6 = (Boolean *)malloc(4);
      Q->ElSorted = pBVar6;
      pBVar6 = (Boolean *)malloc(4);
      Q->DiagElAlloc = pBVar6;
      ppEVar5 = (ElType **)malloc((Dim + 1) * 8);
      Q->DiagEl = ppEVar5;
      pBVar6 = (Boolean *)malloc(4);
      Q->ZeroInDiag = pBVar6;
      pRVar7 = (Real *)malloc((Dim + 1) * 8);
      Q->InvDiagEl = pRVar7;
      pBVar6 = (Boolean *)malloc(4);
      Q->ILUExists = pBVar6;
      pQVar8 = (QMatrixType *)malloc(0xb0);
      Q->ILU = pQVar8;
      if ((((((Q->Len == (size_t *)0x0) || (Q->El == (ElType **)0x0)) ||
            (Q->ElSorted == (Boolean *)0x0)) ||
           ((Q->DiagElAlloc == (Boolean *)0x0 || (Q->DiagEl == (ElType **)0x0)))) ||
          ((Q->ZeroInDiag == (Boolean *)0x0 ||
           ((Q->InvDiagEl == (Real *)0x0 || (Q->ILUExists == (Boolean *)0x0)))))) ||
         (Q->ILU == (QMatrixType *)0x0)) {
        LASError(LASMemAllocErr,"Q_Constr",Name,(char *)0x0,(char *)0x0);
      }
      else {
        for (local_38 = 1; local_38 <= Dim; local_38 = local_38 + 1) {
          Q->Len[local_38] = 0;
          Q->El[local_38] = (ElType *)0x0;
          Q->DiagEl[local_38] = (ElType *)0x0;
          Q->InvDiagEl[local_38] = 0.0;
        }
        *Q->ElSorted = False;
        *Q->DiagElAlloc = False;
        *Q->ZeroInDiag = True;
        *Q->ILUExists = False;
      }
    }
    else {
      Q->Len = (size_t *)0x0;
      Q->El = (ElType **)0x0;
      Q->ElSorted = (Boolean *)0x0;
      Q->DiagElAlloc = (Boolean *)0x0;
      Q->DiagEl = (ElType **)0x0;
      Q->ZeroInDiag = (Boolean *)0x0;
      Q->InvDiagEl = (Real *)0x0;
      Q->ILUExists = (Boolean *)0x0;
      Q->ILU = (QMatrixType *)0x0;
    }
  }
  Q->UnitRightKer = False;
  Q->RightKerCmp = (Real *)0x0;
  Q->UnitLeftKer = False;
  Q->LeftKerCmp = (Real *)0x0;
  Q->EigenvalInfo = (void *)0x0;
  return;
}

Assistant:

void Q_Constr(QMatrix *Q, char *Name, size_t Dim, Boolean Symmetry,
              ElOrderType ElOrder, InstanceType Instance, Boolean OwnData)
/* constructor of the type QMatrix */
{
    size_t RoC;

    Q->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
    if (Q->Name != NULL)
        strcpy(Q->Name, Name);
    else
        LASError(LASMemAllocErr, "Q_Constr", Name, NULL, NULL);
    Q->Dim = Dim;
    Q->Symmetry = Symmetry;
    Q->ElOrder = ElOrder;
    Q->Instance = Instance;
    Q->LockLevel = 0;
    Q->MultiplD = 1.0;
    Q->MultiplU = 1.0;
    Q->MultiplL = 1.0;
    Q->OwnData = OwnData;
    if (OwnData) {
        if (LASResult() == LASOK) {
	    Q->Len = (size_t *)malloc((Dim + 1) * sizeof(size_t));
	    Q->El = (ElType **)malloc((Dim + 1) * sizeof(ElType *));
	    Q->ElSorted = (Boolean *)malloc(sizeof(Boolean));
	    Q->DiagElAlloc = (Boolean *)malloc(sizeof(Boolean));
	    Q->DiagEl = (ElType **)malloc((Dim + 1) * sizeof(ElType *));
	    Q->ZeroInDiag = (Boolean *)malloc(sizeof(Boolean));
            Q->InvDiagEl = (Real *)malloc((Dim + 1) * sizeof(Real));
	    Q->ILUExists = (Boolean *)malloc(sizeof(Boolean));
            Q->ILU = (QMatrix *)malloc(sizeof(QMatrix));
	    if (Q->Len != NULL && Q->El != NULL && Q->ElSorted != NULL
	        && Q->DiagElAlloc != NULL && Q->DiagEl != NULL && Q->ZeroInDiag != NULL
	        && Q->InvDiagEl != NULL && Q->ILUExists != NULL && Q->ILU != NULL) {
                for (RoC = 1; RoC <= Dim; RoC++) {
                    Q->Len[RoC] = 0;
                    Q->El[RoC] = NULL;
                    Q->DiagEl[RoC] = NULL;
                    Q->InvDiagEl[RoC] = 0.0;
                }
                *Q->ElSorted = False;
                *Q->DiagElAlloc = False;
                *Q->ZeroInDiag = True;
                *Q->ILUExists = False;
            } else {
	        LASError(LASMemAllocErr, "Q_Constr", Name, NULL, NULL);
            }
        } else {
	    Q->Len = NULL;
	    Q->El = NULL;
	    Q->ElSorted = NULL;
	    Q->DiagElAlloc = NULL;
	    Q->DiagEl = NULL;
	    Q->ZeroInDiag = NULL;
            Q->InvDiagEl = NULL;
	    Q->ILUExists = NULL;
	    Q->ILU = NULL;
        }
    }
    Q->UnitRightKer = False;
    Q->RightKerCmp = NULL;
    Q->UnitLeftKer = False;
    Q->LeftKerCmp = NULL;
    Q->EigenvalInfo = NULL;
}